

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_add_mixed(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_ecp_point *P,
                 mbedtls_ecp_point *Q)

{
  int iVar1;
  bool bVar2;
  undefined1 local_e0 [8];
  mbedtls_mpi Z;
  mbedtls_mpi Y;
  mbedtls_mpi X;
  mbedtls_mpi T4;
  mbedtls_mpi T3;
  mbedtls_mpi T2;
  mbedtls_mpi T1;
  int ret;
  mbedtls_ecp_point *Q_local;
  mbedtls_ecp_point *P_local;
  mbedtls_ecp_point *R_local;
  mbedtls_ecp_group *grp_local;
  
  add_count = add_count + 1;
  iVar1 = mbedtls_mpi_cmp_int(&P->Z,0);
  if (iVar1 == 0) {
    grp_local._4_4_ = mbedtls_ecp_copy(R,Q);
  }
  else if (((Q->Z).p == (mbedtls_mpi_uint *)0x0) ||
          (iVar1 = mbedtls_mpi_cmp_int(&Q->Z,0), iVar1 != 0)) {
    if (((Q->Z).p == (mbedtls_mpi_uint *)0x0) || (iVar1 = mbedtls_mpi_cmp_int(&Q->Z,1), iVar1 == 0))
    {
      mbedtls_mpi_init((mbedtls_mpi *)&T2.p);
      mbedtls_mpi_init((mbedtls_mpi *)&T3.p);
      mbedtls_mpi_init((mbedtls_mpi *)&T4.p);
      mbedtls_mpi_init((mbedtls_mpi *)&X.p);
      mbedtls_mpi_init((mbedtls_mpi *)&Y.p);
      mbedtls_mpi_init((mbedtls_mpi *)&Z.p);
      mbedtls_mpi_init((mbedtls_mpi *)local_e0);
      T1.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&T2.p,&P->Z,&P->Z);
      if ((T1.p._4_4_ == 0) && (T1.p._4_4_ = ecp_modp((mbedtls_mpi *)&T2.p,grp), T1.p._4_4_ == 0)) {
        mul_count = mul_count + 1;
        T1.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&T3.p,(mbedtls_mpi *)&T2.p,&P->Z);
        if ((T1.p._4_4_ == 0) && (T1.p._4_4_ = ecp_modp((mbedtls_mpi *)&T3.p,grp), T1.p._4_4_ == 0))
        {
          mul_count = mul_count + 1;
          T1.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&T2.p,(mbedtls_mpi *)&T2.p,&Q->X);
          if ((T1.p._4_4_ == 0) &&
             (T1.p._4_4_ = ecp_modp((mbedtls_mpi *)&T2.p,grp), T1.p._4_4_ == 0)) {
            mul_count = mul_count + 1;
            T1.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&T3.p,(mbedtls_mpi *)&T3.p,&Q->Y);
            if ((T1.p._4_4_ == 0) &&
               (T1.p._4_4_ = ecp_modp((mbedtls_mpi *)&T3.p,grp), T1.p._4_4_ == 0)) {
              mul_count = mul_count + 1;
              T1.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&T2.p,(mbedtls_mpi *)&T2.p,&P->X);
              while (T1.p._4_4_ == 0) {
                bVar2 = false;
                if ((int)T2.p < 0) {
                  iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&T2.p,0);
                  bVar2 = iVar1 != 0;
                }
                if (!bVar2) {
                  T1.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&T3.p,(mbedtls_mpi *)&T3.p,&P->Y);
                  goto joined_r0x0019baac;
                }
                T1.p._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&T2.p,(mbedtls_mpi *)&T2.p,&grp->P);
              }
            }
          }
        }
      }
LAB_0019c0ab:
      mbedtls_mpi_free((mbedtls_mpi *)&T2.p);
      mbedtls_mpi_free((mbedtls_mpi *)&T3.p);
      mbedtls_mpi_free((mbedtls_mpi *)&T4.p);
      mbedtls_mpi_free((mbedtls_mpi *)&X.p);
      mbedtls_mpi_free((mbedtls_mpi *)&Y.p);
      mbedtls_mpi_free((mbedtls_mpi *)&Z.p);
      mbedtls_mpi_free((mbedtls_mpi *)local_e0);
      grp_local._4_4_ = T1.p._4_4_;
    }
    else {
      grp_local._4_4_ = -0x4f80;
    }
  }
  else {
    grp_local._4_4_ = mbedtls_ecp_copy(R,P);
  }
  return grp_local._4_4_;
joined_r0x0019baac:
  if (T1.p._4_4_ != 0) goto LAB_0019c0ab;
  bVar2 = false;
  if ((int)T3.p < 0) {
    iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&T3.p,0);
    bVar2 = iVar1 != 0;
  }
  if (!bVar2) {
    iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&T2.p,0);
    if (iVar1 == 0) {
      iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&T3.p,0);
      if (iVar1 == 0) {
        T1.p._4_4_ = ecp_double_jac(grp,R,P);
      }
      else {
        T1.p._4_4_ = mbedtls_ecp_set_zero(R);
      }
    }
    else {
      T1.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)local_e0,&P->Z,(mbedtls_mpi *)&T2.p);
      if ((T1.p._4_4_ == 0) && (T1.p._4_4_ = ecp_modp((mbedtls_mpi *)local_e0,grp), T1.p._4_4_ == 0)
         ) {
        mul_count = mul_count + 1;
        T1.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&T4.p,(mbedtls_mpi *)&T2.p,
                                         (mbedtls_mpi *)&T2.p);
        if ((T1.p._4_4_ == 0) && (T1.p._4_4_ = ecp_modp((mbedtls_mpi *)&T4.p,grp), T1.p._4_4_ == 0))
        {
          mul_count = mul_count + 1;
          T1.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&X.p,(mbedtls_mpi *)&T4.p,
                                           (mbedtls_mpi *)&T2.p);
          if ((T1.p._4_4_ == 0) && (T1.p._4_4_ = ecp_modp((mbedtls_mpi *)&X.p,grp), T1.p._4_4_ == 0)
             ) {
            mul_count = mul_count + 1;
            T1.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&T4.p,(mbedtls_mpi *)&T4.p,&P->X);
            if ((T1.p._4_4_ == 0) &&
               (T1.p._4_4_ = ecp_modp((mbedtls_mpi *)&T4.p,grp), T1.p._4_4_ == 0)) {
              mul_count = mul_count + 1;
              T1.p._4_4_ = mbedtls_mpi_mul_int((mbedtls_mpi *)&T2.p,(mbedtls_mpi *)&T4.p,2);
              goto joined_r0x0019bcd7;
            }
          }
        }
      }
    }
    goto LAB_0019c0ab;
  }
  T1.p._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&T3.p,(mbedtls_mpi *)&T3.p,&grp->P);
  goto joined_r0x0019baac;
joined_r0x0019bcd7:
  if (T1.p._4_4_ != 0) goto LAB_0019c0ab;
  iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&T2.p,&grp->P);
  if (iVar1 < 0) {
    T1.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&Y.p,(mbedtls_mpi *)&T3.p,(mbedtls_mpi *)&T3.p);
    if ((T1.p._4_4_ == 0) && (T1.p._4_4_ = ecp_modp((mbedtls_mpi *)&Y.p,grp), T1.p._4_4_ == 0)) {
      mul_count = mul_count + 1;
      T1.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&Y.p,(mbedtls_mpi *)&Y.p,(mbedtls_mpi *)&T2.p)
      ;
      goto joined_r0x0019bd93;
    }
    goto LAB_0019c0ab;
  }
  T1.p._4_4_ = mbedtls_mpi_sub_abs((mbedtls_mpi *)&T2.p,(mbedtls_mpi *)&T2.p,&grp->P);
  goto joined_r0x0019bcd7;
joined_r0x0019bd93:
  if (T1.p._4_4_ != 0) goto LAB_0019c0ab;
  bVar2 = false;
  if ((int)Y.p < 0) {
    iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&Y.p,0);
    bVar2 = iVar1 != 0;
  }
  if (!bVar2) {
    T1.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&Y.p,(mbedtls_mpi *)&Y.p,(mbedtls_mpi *)&X.p);
    goto joined_r0x0019be1f;
  }
  T1.p._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&Y.p,(mbedtls_mpi *)&Y.p,&grp->P);
  goto joined_r0x0019bd93;
joined_r0x0019be1f:
  if (T1.p._4_4_ != 0) goto LAB_0019c0ab;
  bVar2 = false;
  if ((int)Y.p < 0) {
    iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&Y.p,0);
    bVar2 = iVar1 != 0;
  }
  if (!bVar2) {
    T1.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&T4.p,(mbedtls_mpi *)&T4.p,(mbedtls_mpi *)&Y.p);
    goto joined_r0x0019bea8;
  }
  T1.p._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&Y.p,(mbedtls_mpi *)&Y.p,&grp->P);
  goto joined_r0x0019be1f;
joined_r0x0019bea8:
  if (T1.p._4_4_ != 0) goto LAB_0019c0ab;
  bVar2 = false;
  if ((int)T4.p < 0) {
    iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&T4.p,0);
    bVar2 = iVar1 != 0;
  }
  if (!bVar2) {
    T1.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&T4.p,(mbedtls_mpi *)&T4.p,(mbedtls_mpi *)&T3.p)
    ;
    if ((T1.p._4_4_ == 0) && (T1.p._4_4_ = ecp_modp((mbedtls_mpi *)&T4.p,grp), T1.p._4_4_ == 0)) {
      mul_count = mul_count + 1;
      T1.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&X.p,(mbedtls_mpi *)&X.p,&P->Y);
      if ((T1.p._4_4_ == 0) && (T1.p._4_4_ = ecp_modp((mbedtls_mpi *)&X.p,grp), T1.p._4_4_ == 0)) {
        mul_count = mul_count + 1;
        T1.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&Z.p,(mbedtls_mpi *)&T4.p,
                                         (mbedtls_mpi *)&X.p);
        goto joined_r0x0019bfdc;
      }
    }
    goto LAB_0019c0ab;
  }
  T1.p._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&T4.p,(mbedtls_mpi *)&T4.p,&grp->P);
  goto joined_r0x0019bea8;
joined_r0x0019bfdc:
  if (T1.p._4_4_ != 0) goto LAB_0019c0ab;
  bVar2 = false;
  if ((int)Z.p < 0) {
    iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&Z.p,0);
    bVar2 = iVar1 != 0;
  }
  if (!bVar2) {
    T1.p._4_4_ = mbedtls_mpi_copy(&R->X,(mbedtls_mpi *)&Y.p);
    if ((T1.p._4_4_ == 0) &&
       (T1.p._4_4_ = mbedtls_mpi_copy(&R->Y,(mbedtls_mpi *)&Z.p), T1.p._4_4_ == 0)) {
      T1.p._4_4_ = mbedtls_mpi_copy(&R->Z,(mbedtls_mpi *)local_e0);
    }
    goto LAB_0019c0ab;
  }
  T1.p._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&Z.p,(mbedtls_mpi *)&Z.p,&grp->P);
  goto joined_r0x0019bfdc;
}

Assistant:

static int ecp_add_mixed( const mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                          const mbedtls_ecp_point *P, const mbedtls_ecp_point *Q )
{
    int ret;
    mbedtls_mpi T1, T2, T3, T4, X, Y, Z;

#if defined(MBEDTLS_SELF_TEST)
    add_count++;
#endif

    /*
     * Trivial cases: P == 0 or Q == 0 (case 1)
     */
    if( mbedtls_mpi_cmp_int( &P->Z, 0 ) == 0 )
        return( mbedtls_ecp_copy( R, Q ) );

    if( Q->Z.p != NULL && mbedtls_mpi_cmp_int( &Q->Z, 0 ) == 0 )
        return( mbedtls_ecp_copy( R, P ) );

    /*
     * Make sure Q coordinates are normalized
     */
    if( Q->Z.p != NULL && mbedtls_mpi_cmp_int( &Q->Z, 1 ) != 0 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    mbedtls_mpi_init( &T1 ); mbedtls_mpi_init( &T2 ); mbedtls_mpi_init( &T3 ); mbedtls_mpi_init( &T4 );
    mbedtls_mpi_init( &X ); mbedtls_mpi_init( &Y ); mbedtls_mpi_init( &Z );

    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T1,  &P->Z,  &P->Z ) );  MOD_MUL( T1 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T2,  &T1,    &P->Z ) );  MOD_MUL( T2 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T1,  &T1,    &Q->X ) );  MOD_MUL( T1 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T2,  &T2,    &Q->Y ) );  MOD_MUL( T2 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &T1,  &T1,    &P->X ) );  MOD_SUB( T1 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &T2,  &T2,    &P->Y ) );  MOD_SUB( T2 );

    /* Special cases (2) and (3) */
    if( mbedtls_mpi_cmp_int( &T1, 0 ) == 0 )
    {
        if( mbedtls_mpi_cmp_int( &T2, 0 ) == 0 )
        {
            ret = ecp_double_jac( grp, R, P );
            goto cleanup;
        }
        else
        {
            ret = mbedtls_ecp_set_zero( R );
            goto cleanup;
        }
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &Z,   &P->Z,  &T1   ) );  MOD_MUL( Z  );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T3,  &T1,    &T1   ) );  MOD_MUL( T3 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T4,  &T3,    &T1   ) );  MOD_MUL( T4 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T3,  &T3,    &P->X ) );  MOD_MUL( T3 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &T1,  &T3,    2     ) );  MOD_ADD( T1 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &X,   &T2,    &T2   ) );  MOD_MUL( X  );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &X,   &X,     &T1   ) );  MOD_SUB( X  );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &X,   &X,     &T4   ) );  MOD_SUB( X  );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &T3,  &T3,    &X    ) );  MOD_SUB( T3 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T3,  &T3,    &T2   ) );  MOD_MUL( T3 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T4,  &T4,    &P->Y ) );  MOD_MUL( T4 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &Y,   &T3,    &T4   ) );  MOD_SUB( Y  );

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->X, &X ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->Y, &Y ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->Z, &Z ) );

cleanup:

    mbedtls_mpi_free( &T1 ); mbedtls_mpi_free( &T2 ); mbedtls_mpi_free( &T3 ); mbedtls_mpi_free( &T4 );
    mbedtls_mpi_free( &X ); mbedtls_mpi_free( &Y ); mbedtls_mpi_free( &Z );

    return( ret );
}